

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importedentity.cpp
# Opt level: O2

void __thiscall libcellml::ImportedEntity::~ImportedEntity(ImportedEntity *this)

{
  ImportedEntityImpl *this_00;
  
  this->_vptr_ImportedEntity = (_func_int **)&PTR___cxa_pure_virtual_0029fdf0;
  this_00 = this->mPimpl;
  if (this_00 != (ImportedEntityImpl *)0x0) {
    ImportedEntityImpl::~ImportedEntityImpl(this_00);
  }
  operator_delete(this_00,0x30);
  return;
}

Assistant:

ImportedEntity::~ImportedEntity()
{
    delete mPimpl;
}